

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

sbs_t * sbs_create(void)

{
  sbs_t *psVar1;
  roaring_bitmap_t *prVar2;
  uint64_t *puVar3;
  uint32_t i;
  sbs_t *sbs;
  uint local_c;
  
  psVar1 = (sbs_t *)malloc(0x18);
  prVar2 = roaring_bitmap_create();
  psVar1->roaring = prVar2;
  psVar1->size = 1;
  puVar3 = (uint64_t *)malloc((ulong)psVar1->size << 3);
  psVar1->words = puVar3;
  for (local_c = 0; local_c < psVar1->size; local_c = local_c + 1) {
    psVar1->words[local_c] = 0;
  }
  return psVar1;
}

Assistant:

sbs_t *sbs_create(void) {
    sbs_t *sbs = (sbs_t *)malloc(sizeof(sbs_t));
    sbs->roaring = roaring_bitmap_create();
    sbs->size = 1;
    sbs->words = (uint64_t *)malloc(sbs->size * sizeof(uint64_t));
    for (uint32_t i = 0; i < sbs->size; i++) {
        sbs->words[i] = 0;
    }
    return sbs;
}